

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

void cmSystemTools::ParseUnixCommandLine
               (char *command,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  cmSystemToolsArgV argv;
  cmSystemToolsArgV local_10;
  
  local_10.ArgV = cmsysSystem_Parse_CommandForUnix(command,0);
  cmSystemToolsArgV::Store(&local_10,args);
  cmSystemToolsArgV::~cmSystemToolsArgV(&local_10);
  return;
}

Assistant:

void cmSystemTools::ParseUnixCommandLine(const char* command,
                                         std::vector<std::string>& args)
{
  // Invoke the underlying parser.
  cmSystemToolsArgV argv(cmsysSystem_Parse_CommandForUnix(command, 0));
  argv.Store(args);
}